

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word2vec.c
# Opt level: O2

void ReadWord(char *word,FILE *fin)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  
  uVar3 = 0;
LAB_0010249f:
  do {
    do {
      iVar1 = feof((FILE *)fin);
      if (iVar1 != 0) {
code_r0x001024a7:
        word[uVar3] = '\0';
        return;
      }
      uVar2 = fgetc((FILE *)fin);
    } while (uVar2 == 0xd);
    if ((0x20 < uVar2) || ((0x100000600U >> ((ulong)uVar2 & 0x3f) & 1) == 0)) {
      word[uVar3] = (char)uVar2;
      uVar3 = uVar3 + (uVar3 < 0x62);
      goto LAB_0010249f;
    }
    if (uVar3 != 0) {
      if (uVar2 == 10) {
        ungetc(10,(FILE *)fin);
      }
      goto code_r0x001024a7;
    }
    if (uVar2 == 10) {
      builtin_strncpy(word,"</s>",5);
      return;
    }
  } while( true );
}

Assistant:

void ReadWord(char *word, FILE *fin) {
  int a = 0, ch;
  while (!feof(fin)) {
    ch = fgetc(fin);
    if (ch == 13) continue;
    if ((ch == ' ') || (ch == '\t') || (ch == '\n')) {
      if (a > 0) {
        if (ch == '\n') ungetc(ch, fin);
        break;
      }
      if (ch == '\n') {
        strcpy(word, (char *)"</s>");
        return;
      } else continue;
    }
    word[a] = ch;
    a++;
    if (a >= MAX_STRING - 1) a--;   // Truncate too long words
  }
  word[a] = 0;
}